

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

bool __thiscall PPointer::ReadValue(PPointer *this,FArchive *ar,void *addr)

{
  bool bVar1;
  undefined8 in_RAX;
  BYTE tag;
  byte local_21;
  
  local_21 = (byte)((ulong)in_RAX >> 0x38);
  FArchive::operator<<(ar,&local_21);
  if ((local_21 == 0x10) &&
     (bVar1 = DObject::IsKindOf(&this->PointedType->super_DObject,PClass::RegistrationInfo.MyClass),
     bVar1)) {
    FArchive::operator<<(ar,(DObject **)addr);
    bVar1 = true;
  }
  else {
    PType::SkipValue(ar,(uint)local_21);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool PPointer::ReadValue(FArchive &ar, void *addr) const
{
	BYTE tag;
	ar << tag;
	if (tag == VAL_Object && PointedType->IsKindOf(RUNTIME_CLASS(PClass)))
	{
		ar << *(DObject **)addr;
		return true;
	}
	SkipValue(ar, tag);
	return false;
}